

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json_visitor<char>::string_value
          (basic_json_visitor<char> *this,string_view_type *value,semantic_tag tag,
          ser_context *context)

{
  uint uVar1;
  error_category *peVar2;
  int iVar3;
  int iVar4;
  ser_error *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  error_code ec_00;
  error_code ec;
  uint local_40 [2];
  error_category *local_38;
  
  local_40[0] = 0;
  local_38 = (error_category *)std::_V2::system_category();
  (*this->_vptr_basic_json_visitor[0xc])
            (this,value,CONCAT71(in_register_00000011,tag) & 0xffffffff,context,local_40);
  if (local_40[0] == 0) {
    return true;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar2 = local_38;
  uVar1 = local_40[0];
  iVar3 = (*context->_vptr_ser_context[2])(context);
  iVar4 = (*context->_vptr_ser_context[3])(context);
  ec_00._4_4_ = 0;
  ec_00._M_value = uVar1;
  ec_00._M_cat = peVar2;
  ser_error::ser_error(this_00,ec_00,CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4));
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE string_value(const string_view_type& value, 
            semantic_tag tag = semantic_tag::none, 
            const ser_context& context=ser_context()) 
        {
            std::error_code ec;
            visit_string(value, tag, context, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, context.line(), context.column()));
            }
            JSONCONS_VISITOR_RETURN;
        }